

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::SummarizeBins
          (BamStandardIndex *this,BaiReferenceSummary *refSummary)

{
  int iVar1;
  undefined4 extraout_var;
  int numBins;
  int local_1c;
  
  ReadNumBins(this,&local_1c);
  refSummary->NumBins = local_1c;
  iVar1 = (*((this->m_resources).Device)->_vptr_IBamIODevice[7])();
  refSummary->FirstBinFilePosition = CONCAT44(extraout_var,iVar1);
  SkipBins(this,&local_1c);
  return;
}

Assistant:

void BamStandardIndex::SummarizeBins(BaiReferenceSummary& refSummary)
{

    // load number of bins
    int numBins;
    ReadNumBins(numBins);

    // store bins summary for this reference
    refSummary.NumBins = numBins;
    refSummary.FirstBinFilePosition = Tell();

    // skip this reference's bins
    SkipBins(numBins);
}